

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.cpp
# Opt level: O0

int __thiscall
pg::Verifier::verify
          (Verifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint uVar5;
  int extraout_EAX;
  long lVar6;
  runtime_error *prVar7;
  ostream *poVar8;
  ulong uVar9;
  void *pvVar10;
  void *pvVar11;
  reference pvVar12;
  reference piVar13;
  reference pvVar14;
  uint uVar15;
  _label_vertex _Var16;
  bool local_26d;
  bool local_261;
  int n_2;
  Game *local_1b0;
  int local_1a8;
  _label_vertex local_1a0;
  int local_18c;
  undefined1 local_188 [4];
  int n_1;
  undefined1 local_180 [8];
  reverse_iterator it_1;
  bool cycles;
  int local_164;
  undefined1 local_160 [4];
  int n;
  undefined1 local_158 [8];
  reverse_iterator it;
  uint local_148;
  int scc_size;
  int max_prio;
  int to_2;
  int *curedge_1;
  int to_1;
  int iStack_12c;
  bool pushed;
  int min;
  int v_1;
  int64_t bot;
  uint local_118;
  int winner_1;
  int prio;
  int top;
  int64_t pre;
  stack<int,_std::deque<int,_std::allocator<int>_>_> st;
  vector<int,_std::allocator<int>_> res;
  int i_1;
  int i;
  int64_t *low;
  int *done;
  _label_vertex local_78;
  Game *local_68;
  int local_60;
  _label_vertex local_58;
  int local_44;
  int *piStack_40;
  int to;
  int *curedge;
  byte local_2d;
  int str;
  bool winner;
  int local_1c;
  int local_18;
  int v;
  int n_vertices;
  bool odd_local;
  bool even_local;
  bool fullgame_local;
  Verifier *this_local;
  
  v._3_1_ = (byte)ctx & 1;
  v._2_1_ = (byte)sig & 1;
  v._1_1_ = (byte)siglen & 1;
  _n_vertices = this;
  Game::ensure_sorted(this->game);
  Game::build_in_array(this->game,false);
  lVar6 = Game::vertexcount(this->game);
  local_18 = (int)lVar6;
  for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
    bVar3 = Game::isSolved(this->game,local_1c);
    if (bVar3) {
      iVar4 = Game::getWinner(this->game,local_1c);
      local_2d = iVar4 != 0;
      if ((((bool)local_2d) || ((v._2_1_ & 1) != 0)) && ((!(bool)local_2d || ((v._1_1_ & 1) != 0))))
      {
        uVar15 = (uint)local_2d;
        uVar5 = Game::owner(this->game,local_1c);
        if (uVar15 == uVar5) {
          curedge._4_4_ = Game::getStrategy(this->game,local_1c);
          if (curedge._4_4_ == -1) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"winning vertex has no strategy");
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar3 = Game::has_edge(this->game,local_1c,curedge._4_4_);
          if (!bVar3) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"strategy is not a valid move");
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar3 = Game::isSolved(this->game,curedge._4_4_);
          if ((!bVar3) ||
             (uVar5 = Game::getWinner(this->game,curedge._4_4_), uVar5 != (local_2d & 1))) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"strategy leaves dominion");
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          this->n_strategies = this->n_strategies + 1;
        }
        else {
          for (piStack_40 = Game::outs(this->game,local_1c); *piStack_40 != -1;
              piStack_40 = piStack_40 + 1) {
            local_44 = *piStack_40;
            bVar3 = Game::isSolved(this->game,local_44);
            if ((!bVar3) || (uVar5 = Game::getWinner(this->game,local_44), uVar5 != (local_2d & 1)))
            {
              poVar8 = std::operator<<(this->logger,"escape edge from ");
              _Var16 = Game::label_vertex(this->game,local_1c);
              local_68 = _Var16.g;
              local_60 = _Var16.v;
              local_58.g = local_68;
              local_58.v = local_60;
              poVar8 = operator<<(poVar8,&local_58);
              poVar8 = std::operator<<(poVar8," to ");
              _Var16 = Game::label_vertex(this->game,local_44);
              local_78.g = _Var16.g;
              local_78.v = _Var16.v;
              poVar8 = operator<<(poVar8,&local_78);
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar7,"loser can escape");
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          iVar4 = Game::getStrategy(this->game,local_1c);
          if (iVar4 != -1) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"losing vertex has strategy");
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
    }
    else if ((v._3_1_ & 1) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"not every vertex is won");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_18;
  uVar9 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar9);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_18;
  uVar9 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar9);
  for (res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < local_18;
      res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    *(undefined4 *)
     ((long)pvVar10 +
     (long)res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ * 4) = 0xffffffff;
  }
  for (res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage < local_18;
      res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage + 1) {
    *(undefined8 *)
     ((long)pvVar11 +
     (long)(int)res.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage * 8) = 0;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&pre);
  _prio = 0;
  winner_1 = local_18;
  do {
    do {
      do {
        winner_1 = winner_1 + -1;
        if (winner_1 < 0) {
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          if (pvVar11 != (void *)0x0) {
            operator_delete__(pvVar11);
          }
          std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
                    ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&pre);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     &st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node);
          return extraout_EAX;
        }
        bVar3 = Game::isSolved(this->game,winner_1);
      } while (!bVar3);
      local_118 = Game::priority(this->game,winner_1);
      bot._4_4_ = Game::getWinner(this->game,winner_1);
    } while ((((bot._4_4_ == 0) && ((v._2_1_ & 1) == 0)) ||
             ((bot._4_4_ == 1 && ((v._1_1_ & 1) == 0)))) ||
            ((bot._4_4_ == (local_118 & 1) ||
             (*(uint *)((long)pvVar10 + (long)winner_1 * 4) == local_118))));
    _min = _prio;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&pre,&winner_1);
    while (bVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                             ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&pre),
          ((bVar3 ^ 0xffU) & 1) != 0) {
      pvVar12 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                          ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&pre);
      iStack_12c = *pvVar12;
      if (*(long *)((long)pvVar11 + (long)iStack_12c * 8) <= _min) {
        _prio = _prio + 1;
        *(long *)((long)pvVar11 + (long)iStack_12c * 8) = _prio;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
                    ._M_finish._M_node,&stack0xfffffffffffffed4);
      }
      to_1 = *(int *)((long)pvVar11 + (long)iStack_12c * 8);
      curedge_1._7_1_ = 0;
      iVar4 = Game::getStrategy(this->game,iStack_12c);
      if (iVar4 == -1) {
        for (_max_prio = Game::outs(this->game,iStack_12c); *_max_prio != -1;
            _max_prio = _max_prio + 1) {
          scc_size = *_max_prio;
          iVar4 = Game::priority(this->game,scc_size);
          if ((iVar4 <= (int)local_118) &&
             (*(uint *)((long)pvVar10 + (long)scc_size * 4) != local_118)) {
            if (*(long *)((long)pvVar11 + (long)scc_size * 8) <= _min) {
              std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                        ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&pre,&scc_size);
              curedge_1._7_1_ = 1;
              break;
            }
            if (*(long *)((long)pvVar11 + (long)scc_size * 8) < (long)to_1) {
              to_1 = (int)*(undefined8 *)((long)pvVar11 + (long)scc_size * 8);
            }
          }
        }
      }
      else {
        curedge_1._0_4_ = Game::getStrategy(this->game,iStack_12c);
        iVar4 = Game::priority(this->game,(int)curedge_1);
        if ((iVar4 <= (int)local_118) &&
           (*(uint *)((long)pvVar10 + (long)(int)curedge_1 * 4) != local_118)) {
          if (_min < *(long *)((long)pvVar11 + (long)(int)curedge_1 * 8)) {
            if (*(long *)((long)pvVar11 + (long)(int)curedge_1 * 8) < (long)to_1) {
              to_1 = (int)*(undefined8 *)((long)pvVar11 + (long)(int)curedge_1 * 8);
            }
          }
          else {
            std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                      ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&pre,
                       (value_type *)&curedge_1);
            curedge_1._7_1_ = 1;
          }
        }
      }
      if ((curedge_1._7_1_ & 1) == 0) {
        if ((long)to_1 < *(long *)((long)pvVar11 + (long)iStack_12c * 8)) {
          *(long *)((long)pvVar11 + (long)iStack_12c * 8) = (long)to_1;
          std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
                    ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&pre);
        }
        else {
          local_148 = 0xffffffff;
          it.current._M_current._4_4_ = 0;
          std::vector<int,_std::allocator<int>_>::rbegin
                    ((vector<int,_std::allocator<int>_> *)local_158);
          while( true ) {
            std::vector<int,_std::allocator<int>_>::rend
                      ((vector<int,_std::allocator<int>_> *)local_160);
            bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_158,
                                    (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                     *)local_160);
            if (!bVar3) break;
            piVar13 = std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                   *)local_158);
            local_164 = *piVar13;
            iVar4 = Game::priority(this->game,local_164);
            if ((int)local_148 < iVar4) {
              local_148 = Game::priority(this->game,local_164);
            }
            it.current._M_current._4_4_ = it.current._M_current._4_4_ + 1;
            *(uint *)((long)pvVar10 + (long)local_164 * 4) = local_118;
            if (local_164 == iStack_12c) break;
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
            ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                          *)&stack0xfffffffffffffe90,(int)local_158);
          }
          local_261 = true;
          if (it.current._M_current._4_4_ < 2) {
            iVar4 = Game::getStrategy(this->game,iStack_12c);
            local_261 = true;
            if (iVar4 != iStack_12c) {
              iVar4 = Game::getStrategy(this->game,iStack_12c);
              local_26d = false;
              if (iVar4 == -1) {
                local_26d = Game::has_edge(this->game,iStack_12c,iStack_12c);
              }
              local_261 = local_26d;
            }
          }
          it_1.current._M_current._7_1_ = local_261;
          if ((local_261 != false) && ((local_148 & 1) == (local_118 & 1))) {
            poVar8 = std::operator<<(this->logger,
                                     "\x1b[1;31mscc where loser wins\x1b[m with priority \x1b[1;34m"
                                    );
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_148);
            std::operator<<(poVar8,"\x1b[m");
            std::vector<int,_std::allocator<int>_>::rbegin
                      ((vector<int,_std::allocator<int>_> *)local_180);
            goto LAB_001da824;
          }
          do {
            pvVar14 = std::vector<int,_std::allocator<int>_>::back
                                ((vector<int,_std::allocator<int>_> *)
                                 &st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                  super__Deque_impl_data._M_finish._M_node);
            iVar4 = *pvVar14;
            std::vector<int,_std::allocator<int>_>::pop_back
                      ((vector<int,_std::allocator<int>_> *)
                       &st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node);
          } while (iVar4 != iStack_12c);
          std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
                    ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&pre);
        }
      }
    }
  } while( true );
LAB_001da824:
  std::vector<int,_std::allocator<int>_>::rend((vector<int,_std::allocator<int>_> *)local_188);
  bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                           *)local_180,
                          (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                           *)local_188);
  if (!bVar3) {
LAB_001da947:
    std::ostream::operator<<(this->logger,std::endl<char,std::char_traits<char>>);
    if (pvVar10 != (void *)0x0) {
      operator_delete__(pvVar10);
    }
    if (pvVar11 != (void *)0x0) {
      operator_delete__(pvVar11);
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"loser can win");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar13 = std::
            reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
            ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                         *)local_180);
  local_18c = *piVar13;
  poVar8 = std::operator<<(this->logger," ");
  _Var16 = Game::label_vertex(this->game,local_18c);
  local_1b0 = _Var16.g;
  local_1a8 = _Var16.v;
  local_1a0.g = local_1b0;
  local_1a0.v = local_1a8;
  operator<<(poVar8,&local_1a0);
  if (local_18c == iStack_12c) goto LAB_001da947;
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
  operator++((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)&stack0xfffffffffffffe48,(int)local_180);
  goto LAB_001da824;
}

Assistant:

void
Verifier::verify(bool fullgame, bool even, bool odd)
{
    // ensure the vertices are ordered properly
    game.ensure_sorted();
    // ensure that the arrays are built
    game.build_in_array(false);

    const int n_vertices = game.vertexcount();

    /**
     * The first loop removes all edges from "won" vertices that are not the strategy.
     * This turns each dominion into a single player game.
     * Also some trivial checks are performed.
     */
    for (int v=0; v < n_vertices; v++) {
        // (for full solutions) check whether every vertex is won
        if (!game.isSolved(v)) {
            if (fullgame) throw std::runtime_error("not every vertex is won");
            else continue;
        }

        const bool winner = game.getWinner(v) ;

        if (winner == 0 and !even) continue; // whatever
        if (winner == 1 and !odd) continue; // whatever

        if (winner == game.owner(v)) {
            // if winner, check whether the strategy stays in the dominion
            int str = game.getStrategy(v);
            if (str == -1) {
                throw std::runtime_error("winning vertex has no strategy");
            } else if (!game.has_edge(v, str)) {
                throw std::runtime_error("strategy is not a valid move");
            } else if (!game.isSolved(str) or game.getWinner(str) != winner) {
                throw std::runtime_error("strategy leaves dominion");
            }
            n_strategies++; // number of checked strategies
        } else {
            // if loser, check whether the loser can escape
            for (auto curedge = game.outs(v); *curedge != -1; curedge++) {
                int to = *curedge;
                if (!game.isSolved(to) or game.getWinner(to) != winner) {
                    logger << "escape edge from " << game.label_vertex(v) << " to " << game.label_vertex(to) << std::endl;
                    throw std::runtime_error("loser can escape");
                }
            }
            // and of course check that no strategy is set
            if (game.getStrategy(v) != -1) throw std::runtime_error("losing vertex has strategy");
        }
    }

    // Allocate datastructures for Tarjan search
    int *done = new int[n_vertices];
    int64_t *low = new int64_t[n_vertices];
    for (int i=0; i<n_vertices; i++) done[i] = -1;
    for (int i=0; i<n_vertices; i++) low[i] = 0;

    std::vector<int> res;
    std::stack<int> st;

    int64_t pre = 0;

    for (int top = n_vertices - 1; top >= 0; top--) {
        // only if a dominion
        if (!game.isSolved(top)) continue;

        int prio = game.priority(top);
        int winner = game.getWinner(top);

        // only compute SCC for a (probably) top vertex
        if (winner == 0 and !even) continue; // don't check even dominions
        if (winner == 1 and !odd) continue; // don't check odd dominions

        // only try to find an SCC where the loser wins
        if (winner == (prio&1)) continue;

        // only run the check if not yet done at priority <prio>
        if (done[top] == prio) continue;

        // set <bot> (in tarjan search) to current pre
        int64_t bot = pre;

        // start the tarjan search at vertex <top>
        st.push(top);

        while (!st.empty()) {
            int v = st.top();

            /**
             * When we see it for the first item, we assign the next number to it and add it to <res>.
             */
            if (low[v] <= bot) {
                low[v] = ++pre;
                res.push_back(v);
            }

            /**
             * Now we check all outgoing (allowed) edges.
             * If seen earlier, then update "min"
             * If new, then 'recurse'
             */
            int min = low[v];
            bool pushed = false;
            if (game.getStrategy(v) != -1) {
                int to = game.getStrategy(v);
                if (game.priority(to) > prio) {
                    // skip if to higher priority
                } else if (done[to] == prio) {
                    // skip if already found scc (done[to] set to prio)
                } else if (low[to] <= bot) {
                    // not visited, add to <st> and break!
                    st.push(to);
                    pushed = true;
                } else {
                    // visited, update min
                    if (low[to] < min) min = low[to];
                }
            } else {
                for (auto curedge = game.outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    // skip if to higher priority
                    if (game.priority(to) > prio) continue;
                    // skip if already found scc (done[to] set to prio)
                    if (done[to] == prio) continue;
                    // check if visited in this search
                    if (low[to] <= bot) {
                        // not visited, add to <st> and break!
                        st.push(to);
                        pushed = true;
                        break;
                    } else {
                        // visited, update min
                        if (low[to] < min) min = low[to];
                    }
                }
            }
            if (pushed) continue; // we pushed a new vertex to <st>...

            // there was no edge to a new vertex
            // check if we are the root of a SCC
            if (min < low[v]) {
                // not the root (outgoing edge to lower ranked vertex)
                low[v] = min;
                st.pop();
                continue;
            }

            /**
             * We're the root!
             * Now we need to figure out if we have cycles with p...
             * Also, mark every vertex in the SCC as "done @ search p"
             */
            int max_prio = -1;
            int scc_size = 0;

            for (auto it=res.rbegin(); it!=res.rend(); it++) {
                int n = *it;
                if (game.priority(n) > max_prio) max_prio = game.priority(n);
                scc_size++;
                done[n] = prio; // mark as done at prio
                if (n == v) break;
            }

            bool cycles = scc_size > 1 or game.getStrategy(v) == v or
                (game.getStrategy(v) == -1 and game.has_edge(v, v));

            if (cycles && (max_prio&1) == (prio&1)) {
                /**
                 * Found! Report.
                 */
                logger << "\033[1;31mscc where loser wins\033[m with priority \033[1;34m" << max_prio << "\033[m";
                for (auto it=res.rbegin(); it!=res.rend(); it++) {
                    int n = *it;
                    logger << " " << game.label_vertex(n);
                    if (n == v) break;
                }
                logger << std::endl;
                delete[] done;
                delete[] low;

                throw std::runtime_error("loser can win");
            }

            /**
             * Not found! Continue.
             */
            for (;;) {
                int n = res.back();
                res.pop_back();
                if (n == v) break;
            }
            st.pop();
        }
    }

    delete[] done;
    delete[] low;
}